

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseSimdLane(WastParser *this,Location loc,uint64_t *lane_idx)

{
  ulong uVar1;
  char *s;
  TokenType TVar2;
  Result RVar3;
  Literal *pLVar4;
  char *format;
  undefined8 in_R8;
  undefined8 in_R9;
  allocator<char> local_89;
  Token local_88;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  TVar2 = Peek(this,0);
  if ((TVar2 != Last_Literal) && (TVar2 = Peek(this,0), TVar2 != Int)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"a natural number in range [0, 32)",&local_89);
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               &local_88,&local_88.token_type_);
    RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_48,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    std::__cxx11::string::_M_dispose();
    return (Result)RVar3.enum_;
  }
  Consume(&local_88,this);
  pLVar4 = Token::literal(&local_88);
  uVar1 = (pLVar4->text)._M_len;
  s = (pLVar4->text)._M_str;
  RVar3 = ParseInt64(s,s + uVar1,lane_idx,UnsignedOnly);
  if (RVar3.enum_ == Error) {
    format = "invalid literal \"%.*s\"";
  }
  else {
    if (*lane_idx < 0x100) {
      return (Result)Ok;
    }
    format = "lane index \"%.*s\" out-of-range [0, 32)";
  }
  Error(this,loc,format,uVar1 & 0xffffffff,s,in_R8,in_R9);
  return (Result)Error;
}

Assistant:

Result WastParser::ParseSimdLane(Location loc, uint64_t* lane_idx) {
  if (!PeekMatch(TokenType::Nat) && !PeekMatch(TokenType::Int)) {
    return ErrorExpected({"a natural number in range [0, 32)"});
  }

  Literal literal = Consume().literal();

  Result result =
      ParseInt64(literal.text, lane_idx, ParseIntType::UnsignedOnly);

  if (Failed(result)) {
    Error(loc, "invalid literal \"" PRIstringview "\"",
          WABT_PRINTF_STRING_VIEW_ARG(literal.text));
    return Result::Error;
  }

  // The valid range is only [0, 32), but it's only malformed if it can't
  // fit in a byte.
  if (*lane_idx > 255) {
    Error(loc, "lane index \"" PRIstringview "\" out-of-range [0, 32)",
          WABT_PRINTF_STRING_VIEW_ARG(literal.text));
    return Result::Error;
  }

  return Result::Ok;
}